

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  reference pdVar2;
  long *plVar3;
  int i;
  size_type i_00;
  int t;
  int iVar4;
  int tmp;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> input;
  ESOINN model;
  ifstream ifs;
  int local_2b4;
  unbounded_array<double,_std::allocator<double>_> local_2b0;
  ESOINN local_298;
  istream local_238 [520];
  
  soinn::ESOINN::ESOINN(&local_298,4,4,0x1e,0.001,1.0);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,0x135c40);
  std::ifstream::open((char *)local_238,0x135c4a);
  local_2b0.size_ = 4;
  local_2b0.data_ = (pointer)operator_new(0x20);
  iVar4 = 0;
  do {
    i_00 = 0;
    do {
      std::istream::operator>>(local_238,&local_2b4);
      iVar1 = local_2b4;
      pdVar2 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::operator[]
                         (&local_2b0,i_00);
      *pdVar2 = (double)iVar1;
      i_00 = i_00 + 1;
    } while (i_00 != 4);
    soinn::ESOINN::process
              (&local_298,
               (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&local_2b0);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x96);
  soinn::ESOINN::classify(&local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"number of classes: ",0x13);
  iVar4 = soinn::ESOINN::getNumberOfClasses(&local_298);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"number of vertices: ",0x14);
  iVar4 = soinn::ESOINN::getNumberOfVertices(&local_298);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_2b0.size_ != 0) {
    operator_delete(local_2b0.data_);
  }
  std::ifstream::~ifstream(local_238);
  soinn::ESOINN::~ESOINN(&local_298);
  return 0;
}

Assistant:

int main() {
    soinn::ESOINN model(4, 4, 30);
    std::ifstream ifs;
    ifs.open("input.txt");
    ifs.open("iris.txt");
    boost::numeric::ublas::vector<double> input(4);
    int num;
    int tmp;
    for(int t = 0; t < 150; t++) {
        for(int i = 0; i < 4; i++) {
            ifs>>tmp;
            input(i) = double(tmp);
        }
        model.process(input);
        std::cout<<t<<std::endl;
    }
    model.classify();
    std::cout<<"number of classes: "<<model.getNumberOfClasses()<<std::endl;
    std::cout<<"number of vertices: "<<model.getNumberOfVertices()<<std::endl;
}